

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

void helper_lctl(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  bool bVar1;
  uint32_t uVar2;
  CPUS390XState_conflict *__mptr;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  target_ulong ptr;
  uintptr_t unaff_retaddr;
  
  if ((a2 & 3) == 0) {
    uVar4 = (ulong)r1;
    uVar2 = cpu_ldl_data_ra_s390x(env,a2,unaff_retaddr);
    bVar5 = r1 - 9 < 3 && uVar2 != (uint32_t)env->cregs[uVar4];
    *(uint32_t *)(env->cregs + uVar4) = uVar2;
    if (r1 != r3) {
      ptr = a2 + 4;
      bVar1 = bVar5;
      do {
        uVar3 = (int)uVar4 + 1U & 0xf;
        uVar4 = (ulong)uVar3;
        uVar2 = cpu_ldl_data_ra_s390x(env,ptr,unaff_retaddr);
        bVar5 = bVar1;
        if (uVar3 - 9 < 3) {
          bVar5 = true;
        }
        if (uVar2 == (uint32_t)env->cregs[uVar4]) {
          bVar5 = bVar1;
        }
        env->cregs[uVar4] = env->cregs[uVar4] & 0xffffffff00000000 | (ulong)uVar2;
        ptr = ptr + 4;
        bVar1 = bVar5;
      } while (uVar3 != r3);
    }
    if ((bVar5) && (((env->psw).mask & 0x4000000000000000) != 0)) {
      s390_cpu_recompute_watchpoints((CPUState *)(env[-0x1e].vregs + 0xf));
    }
    tlb_flush_s390x((CPUState *)(env[-0x1e].vregs + 0xf));
    return;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

void HELPER(lctl)(CPUS390XState *env, uint32_t r1, uint64_t a2, uint32_t r3)
{
    uintptr_t ra = GETPC();
    bool PERchanged = false;
    uint64_t src = a2;
    uint32_t i;

    if (src & 0x3) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    for (i = r1;; i = (i + 1) % 16) {
        uint32_t val = cpu_ldl_data_ra(env, src, ra);
        if ((uint32_t)env->cregs[i] != val && i >= 9 && i <= 11) {
            PERchanged = true;
        }
        env->cregs[i] = deposit64(env->cregs[i], 0, 32, val);
        HELPER_LOG("load ctl %d from 0x%" PRIx64 " == 0x%x\n", i, src, val);
        src += sizeof(uint32_t);

        if (i == r3) {
            break;
        }
    }

    if (PERchanged && env->psw.mask & PSW_MASK_PER) {
        s390_cpu_recompute_watchpoints(env_cpu(env));
    }

    tlb_flush(env_cpu(env));
}